

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O1

bool __thiscall
duckdb::BitstringAggBindData::Equals(BitstringAggBindData *this,FunctionData *other_p)

{
  bool bVar1;
  
  if (((((this->min).is_null != true) || (*(char *)&other_p[4]._vptr_FunctionData != '\x01')) ||
      ((this->max).is_null != true)) ||
     (bVar1 = true, *(char *)&other_p[0xc]._vptr_FunctionData == '\0')) {
    bVar1 = Value::NotDistinctFrom(&this->min,(Value *)(other_p + 1));
    if ((bVar1) && (bVar1 = Value::NotDistinctFrom(&this->max,(Value *)(other_p + 9)), bVar1)) {
      return true;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Equals(const FunctionData &other_p) const override {
		auto &other = other_p.Cast<BitstringAggBindData>();
		if (min.IsNull() && other.min.IsNull() && max.IsNull() && other.max.IsNull()) {
			return true;
		}
		if (Value::NotDistinctFrom(min, other.min) && Value::NotDistinctFrom(max, other.max)) {
			return true;
		}
		return false;
	}